

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O0

Node verona::make_fq(Lookup *lookup,bool fresh)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  element_type *peVar2;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  size_t __val;
  Node *pNVar3;
  int iVar4;
  Lookup *pLVar5;
  byte in_DL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  void *__child_stack_03;
  void *__child_stack_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined7 in_register_00000031;
  void *in_R8;
  Node NVar7;
  shared_ptr<trieste::NodeDef> local_5e8;
  shared_ptr<trieste::NodeDef> local_5d8;
  shared_ptr<trieste::NodeDef> local_5c8;
  TokenDef local_5b8;
  Node local_5a8;
  Node local_598;
  TokenDef local_588;
  Node local_578;
  undefined1 local_568 [8];
  Node t;
  TokenDef local_530;
  Node local_520;
  Token local_510;
  Token local_508;
  Token local_500;
  Token local_4f8;
  initializer_list<trieste::Token> local_4f0;
  undefined1 local_4e0 [80];
  undefined1 local_490 [32];
  Token local_470;
  Node local_468;
  Token local_458;
  WFLookup local_450;
  shared_ptr<trieste::NodeDef> local_430;
  Node local_420;
  Token local_410;
  WFLookup local_408;
  shared_ptr<trieste::NodeDef> local_3e8;
  Node local_3d8;
  TokenDef local_3c8;
  Node local_3b8;
  Node local_3a8;
  Node local_398;
  Node local_388;
  shared_ptr<trieste::NodeDef> local_378;
  shared_ptr<trieste::NodeDef> local_368;
  Token local_358;
  WFLookup local_350;
  undefined1 local_330 [8];
  string arity;
  Token local_308;
  WFLookup local_300;
  shared_ptr<trieste::NodeDef> local_2e0;
  Node local_2d0;
  TokenDef local_2c0;
  Node local_2b0;
  shared_ptr<trieste::NodeDef> local_2a0;
  shared_ptr<trieste::NodeDef> local_290;
  Token local_280;
  Token local_278;
  WFLookup local_270;
  shared_ptr<trieste::NodeDef> local_250;
  Node local_240;
  TokenDef local_230;
  Node local_220;
  shared_ptr<trieste::NodeDef> local_210;
  shared_ptr<trieste::NodeDef> local_200;
  Token local_1f0;
  Node local_1e8;
  Token local_1d8;
  WFLookup local_1d0;
  shared_ptr<trieste::NodeDef> local_1b0;
  Node local_1a0;
  TokenDef local_190;
  Node local_180;
  Node local_170;
  shared_ptr<trieste::NodeDef> local_160;
  shared_ptr<trieste::NodeDef> local_150;
  Token local_140;
  Node local_138;
  Token local_128;
  WFLookup local_120;
  shared_ptr<trieste::NodeDef> local_100;
  Node local_f0;
  TokenDef local_e0;
  Node local_d0;
  Node local_c0;
  shared_ptr<trieste::NodeDef> local_b0;
  shared_ptr<trieste::NodeDef> local_a0 [2];
  Token local_80;
  undefined1 local_78 [8];
  Node node;
  Node path;
  Token TStack_50;
  Token TStack_48;
  Token TStack_40;
  Token TStack_38;
  initializer_list<trieste::Token> local_30;
  byte local_19;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_18;
  bool fresh_local;
  Lookup *lookup_local;
  
  p_Stack_18 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT71(in_register_00000031,fresh);
  local_19 = in_DL & 1;
  pLVar5 = lookup;
  lookup_local = lookup;
  peVar2 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Stack_18);
  trieste::Token::Token
            ((Token *)&path.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(TokenDef *)Class);
  trieste::Token::Token(&TStack_50,(TokenDef *)TypeAlias);
  trieste::Token::Token(&TStack_48,(TokenDef *)TypeParam);
  trieste::Token::Token(&TStack_40,(TokenDef *)Trait);
  trieste::Token::Token(&TStack_38,(TokenDef *)Function);
  local_30._M_array =
       (iterator)&path.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_30._M_len = 5;
  bVar1 = trieste::NodeDef::in(peVar2,&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    trieste::TokenDef::operator_cast_to_shared_ptr
              ((TokenDef *)
               &node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::shared_ptr<trieste::NodeDef>::shared_ptr
              ((shared_ptr<trieste::NodeDef> *)local_78,(shared_ptr<trieste::NodeDef> *)p_Stack_18);
    while (bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78), bVar1) {
      trieste::Token::Token(&local_80,(TokenDef *)Class);
      bVar1 = trieste::operator==((Node *)local_78,&local_80);
      iVar4 = (int)pLVar5;
      if (bVar1) {
        ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                  (&local_b0,
                   (shared_ptr<trieste::NodeDef> *)
                   &node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        trieste::TokenDef::operator_cast_to_shared_ptr(&local_e0);
        trieste::Token::Token(&local_128,(TokenDef *)Ident);
        trieste::operator/(&local_120,(Node *)local_78,&local_128);
        pNVar3 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_120);
        ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_100,pNVar3);
        trieste::clone((trieste *)&local_f0,(__fn *)&local_100,__child_stack,iVar4,in_R8);
        trieste::operator<<((trieste *)&local_d0,(Node *)&local_e0,&local_f0);
        pLVar5 = (Lookup *)(ulong)(local_19 & 1);
        make_typeargs(&local_138,(Lookup *)local_78,SUB81(p_Stack_18,0));
        trieste::operator<<((trieste *)&local_c0,&local_d0,&local_138);
        trieste::operator<<((trieste *)local_a0,&local_b0,&local_c0);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(local_a0);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_c0);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_138);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_d0);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_f0);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_100);
        trieste::wf::detail::WFLookup::~WFLookup(&local_120);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)&local_e0);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_b0);
      }
      else {
        trieste::Token::Token(&local_140,(TokenDef *)TypeAlias);
        bVar1 = trieste::operator==((Node *)local_78,&local_140);
        iVar4 = (int)pLVar5;
        if (bVar1) {
          ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                    (&local_160,
                     (shared_ptr<trieste::NodeDef> *)
                     &node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          trieste::TokenDef::operator_cast_to_shared_ptr(&local_190);
          trieste::Token::Token(&local_1d8,(TokenDef *)Ident);
          trieste::operator/(&local_1d0,(Node *)local_78,&local_1d8);
          pNVar3 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_1d0);
          ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_1b0,pNVar3);
          trieste::clone((trieste *)&local_1a0,(__fn *)&local_1b0,__child_stack_00,iVar4,in_R8);
          trieste::operator<<((trieste *)&local_180,(Node *)&local_190,&local_1a0);
          pLVar5 = (Lookup *)(ulong)(local_19 & 1);
          make_typeargs(&local_1e8,(Lookup *)local_78,SUB81(p_Stack_18,0));
          trieste::operator<<((trieste *)&local_170,&local_180,&local_1e8);
          trieste::operator<<((trieste *)&local_150,&local_160,&local_170);
          ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_150);
          ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_170);
          ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_1e8);
          ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_180);
          ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_1a0);
          ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_1b0);
          trieste::wf::detail::WFLookup::~WFLookup(&local_1d0);
          ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                    ((shared_ptr<trieste::NodeDef> *)&local_190);
          ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_160);
        }
        else {
          trieste::Token::Token(&local_1f0,(TokenDef *)TypeParam);
          bVar1 = trieste::operator==((Node *)local_78,&local_1f0);
          if (bVar1) {
            ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                      (&local_210,
                       (shared_ptr<trieste::NodeDef> *)
                       &node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            trieste::TokenDef::operator_cast_to_shared_ptr(&local_230);
            trieste::Token::Token(&local_278,(TokenDef *)Ident);
            trieste::operator/(&local_270,(Node *)local_78,&local_278);
            pNVar3 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_270);
            ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_250,pNVar3);
            trieste::clone((trieste *)&local_240,(__fn *)&local_250,__child_stack_01,(int)pLVar5,
                           in_R8);
            trieste::operator<<((trieste *)&local_220,(Node *)&local_230,&local_240);
            trieste::operator<<((trieste *)&local_200,&local_210,&local_220);
            ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_200);
            ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_220);
            ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_240);
            ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_250);
            trieste::wf::detail::WFLookup::~WFLookup(&local_270);
            ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                      ((shared_ptr<trieste::NodeDef> *)&local_230);
            ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_210);
          }
          else {
            trieste::Token::Token(&local_280,(TokenDef *)Trait);
            bVar1 = trieste::operator==((Node *)local_78,&local_280);
            if (bVar1) {
              ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                        (&local_2a0,
                         (shared_ptr<trieste::NodeDef> *)
                         &node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              trieste::TokenDef::operator_cast_to_shared_ptr(&local_2c0);
              trieste::Token::Token(&local_308,(TokenDef *)Ident);
              trieste::operator/(&local_300,(Node *)local_78,&local_308);
              pNVar3 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_300);
              ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_2e0,pNVar3);
              trieste::clone((trieste *)&local_2d0,(__fn *)&local_2e0,__child_stack_02,(int)pLVar5,
                             in_R8);
              trieste::operator<<((trieste *)&local_2b0,(Node *)&local_2c0,&local_2d0);
              trieste::operator<<((trieste *)&local_290,&local_2a0,&local_2b0);
              ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_290);
              ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_2b0);
              ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_2d0);
              ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_2e0);
              trieste::wf::detail::WFLookup::~WFLookup(&local_300);
              ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                        ((shared_ptr<trieste::NodeDef> *)&local_2c0);
              ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_2a0);
            }
            else {
              trieste::Token::Token((Token *)((long)&arity.field_2 + 8),(TokenDef *)Function);
              bVar1 = trieste::operator==((Node *)local_78,(Token *)((long)&arity.field_2 + 8));
              iVar4 = (int)pLVar5;
              if (bVar1) {
                trieste::Token::Token(&local_358,(TokenDef *)Params);
                trieste::operator/(&local_350,(Node *)local_78,&local_358);
                this_00 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)trieste::wf::detail::WFLookup::operator->(&local_350);
                peVar2 = ::std::
                         __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->(this_00);
                __val = trieste::NodeDef::size(peVar2);
                ::std::__cxx11::to_string((string *)local_330,__val);
                trieste::wf::detail::WFLookup::~WFLookup(&local_350);
                ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                          (&local_378,
                           (shared_ptr<trieste::NodeDef> *)
                           &node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                trieste::TokenDef::operator_cast_to_shared_ptr(&local_3c8);
                trieste::Token::Token(&local_410,(TokenDef *)Ref);
                trieste::operator/(&local_408,(Node *)local_78,&local_410);
                pNVar3 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_408);
                ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_3e8,pNVar3);
                trieste::clone((trieste *)&local_3d8,(__fn *)&local_3e8,__child_stack_03,iVar4,in_R8
                              );
                trieste::operator<<((trieste *)&local_3b8,(Node *)&local_3c8,&local_3d8);
                trieste::Token::Token(&local_458,(TokenDef *)Ident);
                trieste::operator/(&local_450,(Node *)local_78,&local_458);
                pNVar3 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_450);
                ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_430,pNVar3);
                trieste::clone((trieste *)&local_420,(__fn *)&local_430,__child_stack_04,iVar4,in_R8
                              );
                trieste::operator<<((trieste *)&local_3a8,&local_3b8,&local_420);
                trieste::Token::Token(&local_470,(TokenDef *)Int);
                trieste::operator^((trieste *)&local_468,&local_470,(string *)local_330);
                trieste::operator<<((trieste *)&local_398,&local_3a8,&local_468);
                pLVar5 = (Lookup *)(ulong)(local_19 & 1);
                make_typeargs((Node *)(local_490 + 0x10),(Lookup *)local_78,SUB81(p_Stack_18,0));
                trieste::operator<<((trieste *)&local_388,&local_398,(Node *)(local_490 + 0x10));
                trieste::operator<<((trieste *)&local_368,&local_378,&local_388);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_368);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_388);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                          ((shared_ptr<trieste::NodeDef> *)(local_490 + 0x10));
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_398);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_468);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_3a8);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_420);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_430);
                trieste::wf::detail::WFLookup::~WFLookup(&local_450);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_3b8);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_3d8);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_3e8);
                trieste::wf::detail::WFLookup::~WFLookup(&local_408);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                          ((shared_ptr<trieste::NodeDef> *)&local_3c8);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_378);
                ::std::__cxx11::string::~string((string *)local_330);
              }
            }
          }
        }
      }
      peVar2 = ::std::
               __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_78);
      trieste::Token::Token((Token *)(local_4e0 + 0x20),(TokenDef *)Class);
      trieste::Token::Token((Token *)(local_4e0 + 0x28),(TokenDef *)TypeAlias);
      trieste::Token::Token((Token *)(local_4e0 + 0x30),(TokenDef *)Trait);
      trieste::Token::Token((Token *)(local_4e0 + 0x38),(TokenDef *)Function);
      local_4e0._64_8_ = local_4e0 + 0x20;
      local_4e0._72_8_ = (NodeDef *)0x4;
      trieste::NodeDef::parent((NodeDef *)local_490,(initializer_list<trieste::Token> *)peVar2);
      ::std::shared_ptr<trieste::NodeDef>::operator=
                ((shared_ptr<trieste::NodeDef> *)local_78,(shared_ptr<trieste::NodeDef> *)local_490)
      ;
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_490);
    }
    this = &node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    peVar2 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_4e0._24_8_ = trieste::NodeDef::begin(peVar2);
    peVar2 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_4e0._16_8_ = trieste::NodeDef::end(peVar2);
    ::std::
    reverse<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>
              ((__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                )local_4e0._24_8_,
               (__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                )local_4e0._16_8_);
    ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    trieste::NodeDef::pop_back((NodeDef *)local_4e0);
    ::std::shared_ptr<trieste::NodeDef>::operator=
              ((shared_ptr<trieste::NodeDef> *)local_78,(shared_ptr<trieste::NodeDef> *)local_4e0);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_4e0);
    peVar2 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_78);
    trieste::Token::Token(&local_510,(TokenDef *)TypeClassName);
    trieste::Token::Token(&local_508,(TokenDef *)TypeAliasName);
    trieste::Token::Token(&local_500,(TokenDef *)TypeParamName);
    trieste::Token::Token(&local_4f8,(TokenDef *)TypeTraitName);
    local_4f0._M_array = &local_510;
    local_4f0._M_len = 4;
    bVar1 = trieste::NodeDef::in(peVar2,&local_4f0);
    if (bVar1) {
      trieste::TokenDef::operator_cast_to_shared_ptr(&local_530);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                ((shared_ptr<trieste::NodeDef> *)&stack0xfffffffffffffac0,
                 (shared_ptr<trieste::NodeDef> *)
                 &node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      trieste::operator<<((trieste *)&local_520,(Node *)&local_530,
                          (shared_ptr<trieste::NodeDef> *)&stack0xfffffffffffffac0);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                ((shared_ptr<trieste::NodeDef> *)&stack0xfffffffffffffab0,
                 (shared_ptr<trieste::NodeDef> *)local_78);
      trieste::operator<<((trieste *)lookup,&local_520,
                          (shared_ptr<trieste::NodeDef> *)&stack0xfffffffffffffab0);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                ((shared_ptr<trieste::NodeDef> *)&stack0xfffffffffffffab0);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_520);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                ((shared_ptr<trieste::NodeDef> *)&stack0xfffffffffffffac0);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)&local_530);
      t.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1
      ;
    }
    else {
      peVar2 = ::std::
               __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      bVar1 = trieste::NodeDef::empty(peVar2);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!path->empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                      ,0x18a,"Node verona::make_fq(Lookup &, bool)");
      }
      ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      trieste::NodeDef::pop_back((NodeDef *)local_568);
      trieste::TokenDef::operator_cast_to_shared_ptr(&local_588);
      trieste::TokenDef::operator_cast_to_shared_ptr(&local_5b8);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                (&local_5c8,
                 (shared_ptr<trieste::NodeDef> *)
                 &node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      trieste::operator<<((trieste *)&local_5a8,(Node *)&local_5b8,&local_5c8);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                (&local_5d8,(shared_ptr<trieste::NodeDef> *)local_568);
      trieste::operator<<((trieste *)&local_598,&local_5a8,&local_5d8);
      trieste::operator<<((trieste *)&local_578,(Node *)&local_588,&local_598);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                (&local_5e8,(shared_ptr<trieste::NodeDef> *)local_78);
      trieste::operator<<((trieste *)lookup,&local_578,&local_5e8);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_5e8);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_578);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_598);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_5d8);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_5a8);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_5c8);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)&local_5b8);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)&local_588);
      t.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1
      ;
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_568);
    }
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_78);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
              ((shared_ptr<trieste::NodeDef> *)
               &node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var6._M_pi = extraout_RDX_00;
  }
  else {
    ::std::shared_ptr<trieste::NodeDef>::shared_ptr
              (&lookup->def,(shared_ptr<trieste::NodeDef> *)p_Stack_18);
    _Var6._M_pi = extraout_RDX;
  }
  NVar7.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  NVar7.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)lookup;
  return (Node)NVar7.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Node make_fq(Lookup& lookup, bool fresh)
  {
    if (!lookup.def->in({Class, TypeAlias, TypeParam, Trait, Function}))
      return lookup.def;

    Node path = TypePath;
    auto node = lookup.def;

    while (node)
    {
      if (node == Class)
      {
        path
          << (TypeClassName << clone(node / Ident)
                            << make_typeargs(node, lookup, fresh));
      }
      else if (node == TypeAlias)
      {
        path
          << (TypeAliasName << clone(node / Ident)
                            << make_typeargs(node, lookup, fresh));
      }
      else if (node == TypeParam)
      {
        path << (TypeParamName << clone(node / Ident));
      }
      else if (node == Trait)
      {
        path << (TypeTraitName << clone(node / Ident));
      }
      else if (node == Function)
      {
        auto arity = std::to_string((node / Params)->size());

        path
          << (Selector << clone(node / Ref) << clone(node / Ident)
                       << (Int ^ arity) << make_typeargs(node, lookup, fresh));
      }

      node = node->parent({Class, TypeAlias, Trait, Function});
    }

    std::reverse(path->begin(), path->end());
    node = path->pop_back();

    if (node->in({TypeClassName, TypeAliasName, TypeParamName, TypeTraitName}))
      return FQType << path << node;

    assert(!path->empty());
    auto t = path->pop_back();
    return FQFunction << (FQType << path << t) << node;
  }